

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SocketLip.cpp
# Opt level: O0

function<void_(UdpSocket_*)> * __thiscall
UdpSocket::BindFuncBytesReceived
          (function<void_(UdpSocket_*)> *__return_storage_ptr__,UdpSocket *this,
          function<void_(UdpSocket_*)> *fBytesReceived)

{
  BaseSocketImpl *pBVar1;
  long *local_68;
  function<void_(UdpSocket_*)> local_40;
  function<void_(UdpSocket_*)> *local_20;
  function<void_(UdpSocket_*)> *fBytesReceived_local;
  UdpSocket *this_local;
  
  local_20 = fBytesReceived;
  fBytesReceived_local = (function<void_(UdpSocket_*)> *)this;
  this_local = (UdpSocket *)__return_storage_ptr__;
  pBVar1 = BaseSocket::GetImpl(&this->super_BaseSocket);
  if (pBVar1 == (BaseSocketImpl *)0x0) {
    local_68 = (long *)0x0;
  }
  else {
    local_68 = (long *)__dynamic_cast(pBVar1,&BaseSocketImpl::typeinfo,&UdpSocketImpl::typeinfo,0);
  }
  std::function<void_(UdpSocket_*)>::function(&local_40,fBytesReceived);
  (**(code **)(*local_68 + 200))(__return_storage_ptr__,local_68,&local_40);
  std::function<void_(UdpSocket_*)>::~function(&local_40);
  return __return_storage_ptr__;
}

Assistant:

std::function<void(UdpSocket*)> UdpSocket::BindFuncBytesReceived(std::function<void(UdpSocket*)> fBytesReceived)
{
    return dynamic_cast<UdpSocketImpl*>(GetImpl())->BindFuncBytesReceived(fBytesReceived);
}